

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O0

gnode_t * gnode_loop_stat_create
                    (gtoken_s token,gnode_t *cond,gnode_t *stmt,gnode_t *expr,gnode_t *decl,
                    uint32_t block_length)

{
  gnode_t *pgVar1;
  gnode_loop_stmt_t *node;
  uint32_t block_length_local;
  gnode_t *decl_local;
  gnode_t *expr_local;
  gnode_t *stmt_local;
  gnode_t *cond_local;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x68);
  pgVar1->tag = NODE_LOOP_STAT;
  memcpy(&pgVar1->token,&token,0x28);
  pgVar1->decl = decl;
  pgVar1->block_length = block_length;
  *(gnode_t **)(pgVar1 + 1) = cond;
  *(gnode_t **)&pgVar1[1].block_length = stmt;
  *(gnode_t **)&pgVar1[1].token = expr;
  pgVar1[1].token.colno = 0xffffffff;
  return pgVar1;
}

Assistant:

gnode_t *gnode_loop_stat_create (gtoken_s token, gnode_t *cond, gnode_t *stmt, gnode_t *expr, gnode_t *decl, uint32_t block_length) {
    gnode_loop_stmt_t *node = (gnode_loop_stmt_t *)mem_alloc(NULL, sizeof(gnode_loop_stmt_t));

    SETBASE(node, NODE_LOOP_STAT, token);
    SETDECL(node, decl);
    node->base.block_length = block_length;
    node->cond = cond;
    node->stmt = stmt;
    node->expr = expr;
    node->nclose = UINT32_MAX;
    return (gnode_t *)node;
}